

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O1

void __thiscall
flatbuffers::cpp::CppGenerator::GenKeyFieldMethods(CppGenerator *this,FieldDef *field)

{
  Value *type_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  BaseType BVar3;
  StructDef *struct_def;
  _Alloc_hider *p_Var4;
  CppGenerator *pCVar5;
  long *plVar6;
  undefined8 *puVar7;
  mapped_type *pmVar8;
  size_type *psVar9;
  ulong *puVar10;
  long *plVar11;
  CodeWriter *this_00;
  undefined8 uVar12;
  _Alloc_hider _Var13;
  byte bVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  string input_type;
  string type;
  string local_578;
  key_type local_558;
  CppGenerator *local_538;
  string local_530;
  undefined1 local_510 [32];
  string local_4f0;
  string local_4d0;
  string local_4b0;
  string local_490;
  string local_470;
  string local_450;
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  if (field->key == false) {
    __assert_fail("field.key",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_cpp.cpp"
                  ,0x973,"void flatbuffers::cpp::CppGenerator::GenKeyFieldMethods(const FieldDef &)"
                 );
  }
  BVar3 = (field->value).type.base_type;
  if (BVar3 == BASE_TYPE_STRUCT) {
    bVar14 = ((field->value).type.struct_def)->fixed;
  }
  else {
    bVar14 = 0;
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,
             "  bool KeyCompareLessThan(const {{STRUCT_NAME}} * const o) const {","");
  this_00 = &this->code_;
  local_538 = this;
  CodeWriter::operator+=(this_00,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if (BVar3 == BASE_TYPE_STRING) {
    paVar15 = &local_50.field_2;
    local_50._M_dataplus._M_p = (pointer)paVar15;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"    return *{{FIELD_NAME}}() < *o->{{FIELD_NAME}}();","");
    CodeWriter::operator+=(this_00,&local_50);
    _Var13._M_p = local_50._M_dataplus._M_p;
  }
  else if ((BVar3 != BASE_TYPE_ARRAY & (bVar14 ^ 1)) == 0) {
    paVar15 = &local_70.field_2;
    local_70._M_dataplus._M_p = (pointer)paVar15;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"    return KeyCompareWithValue(o->{{FIELD_NAME}}()) < 0;","");
    CodeWriter::operator+=(this_00,&local_70);
    _Var13._M_p = local_70._M_dataplus._M_p;
  }
  else {
    paVar15 = &local_90.field_2;
    local_90._M_dataplus._M_p = (pointer)paVar15;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"    return {{FIELD_NAME}}() < o->{{FIELD_NAME}}();","");
    CodeWriter::operator+=(this_00,&local_90);
    _Var13._M_p = local_90._M_dataplus._M_p;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var13._M_p != paVar15) {
    operator_delete(_Var13._M_p,paVar15->_M_allocated_capacity + 1);
  }
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"  }","");
  CodeWriter::operator+=(this_00,&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  pCVar5 = local_538;
  if (BVar3 == BASE_TYPE_STRING) {
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f0,"  int KeyCompareWithValue(const char *_{{FIELD_NAME}}) const {",
               "");
    CodeWriter::operator+=(this_00,&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_110,"    return strcmp({{FIELD_NAME}}()->c_str(), _{{FIELD_NAME}});"
               ,"");
    CodeWriter::operator+=(this_00,&local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"  }","");
    CodeWriter::operator+=(this_00,&local_130);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_150,"  template<typename StringType>","");
    CodeWriter::operator+=(this_00,&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_170,
               "  int KeyCompareWithValue(const StringType& _{{FIELD_NAME}}) const {","");
    CodeWriter::operator+=(this_00,&local_170);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
    }
    local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_190,
               "    if ({{FIELD_NAME}}()->c_str() < _{{FIELD_NAME}}) return -1;","");
    CodeWriter::operator+=(this_00,&local_190);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2) {
      operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
    }
    local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1b0,"    if (_{{FIELD_NAME}} < {{FIELD_NAME}}()->c_str()) return 1;"
               ,"");
    CodeWriter::operator+=(this_00,&local_1b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
    }
    local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"    return 0;","");
    CodeWriter::operator+=(this_00,&local_1d0);
    local_250.field_2._M_allocated_capacity = local_1d0.field_2._M_allocated_capacity;
    _Var13._M_p = local_1d0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p == &local_1d0.field_2) goto LAB_00187dfe;
  }
  else if (BVar3 == BASE_TYPE_ARRAY) {
    local_510._8_8_ = (field->value).type.struct_def;
    local_510._16_8_ = (field->value).type.enum_def;
    local_510._24_2_ = (field->value).type.fixed_length;
    local_510._4_4_ = 0;
    local_510._0_4_ = (field->value).type.element;
    GenTypeGet_abi_cxx11_(&local_4b0,local_538,(Type *)local_510,"","","",false);
    plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_4b0,0,(char *)0x0,0x368d1e);
    psVar9 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_4f0.field_2._M_allocated_capacity = *psVar9;
      local_4f0.field_2._8_8_ = plVar6[3];
      local_4f0._M_dataplus._M_p = (pointer)&local_4f0.field_2;
    }
    else {
      local_4f0.field_2._M_allocated_capacity = *psVar9;
      local_4f0._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_4f0._M_string_length = plVar6[1];
    *plVar6 = (long)psVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_4f0);
    paVar15 = &local_530.field_2;
    puVar10 = (ulong *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar10) {
      local_530.field_2._M_allocated_capacity = *puVar10;
      local_530.field_2._8_8_ = plVar6[3];
      local_530._M_dataplus._M_p = (pointer)paVar15;
    }
    else {
      local_530.field_2._M_allocated_capacity = *puVar10;
      local_530._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_530._M_string_length = plVar6[1];
    *plVar6 = (long)puVar10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    NumToString<unsigned_short>(&local_490,local_510._24_2_);
    uVar12 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_530._M_dataplus._M_p != paVar15) {
      uVar12 = local_530.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar12 < local_490._M_string_length + local_530._M_string_length) {
      uVar12 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_490._M_dataplus._M_p != &local_490.field_2) {
        uVar12 = local_490.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar12 < local_490._M_string_length + local_530._M_string_length)
      goto LAB_0018747e;
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_490,0,(char *)0x0,(ulong)local_530._M_dataplus._M_p);
    }
    else {
LAB_0018747e:
      puVar7 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_530,(ulong)local_490._M_dataplus._M_p)
      ;
    }
    local_558._M_dataplus._M_p = (pointer)&local_558.field_2;
    psVar9 = puVar7 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_558.field_2._M_allocated_capacity = *psVar9;
      local_558.field_2._8_8_ = puVar7[3];
    }
    else {
      local_558.field_2._M_allocated_capacity = *psVar9;
      local_558._M_dataplus._M_p = (pointer)*puVar7;
    }
    local_558._M_string_length = puVar7[1];
    *puVar7 = psVar9;
    puVar7[1] = 0;
    *(undefined1 *)psVar9 = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_558);
    local_578._M_dataplus._M_p = (pointer)&local_578.field_2;
    plVar11 = plVar6 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)plVar11) {
      local_578.field_2._M_allocated_capacity = *plVar11;
      local_578.field_2._8_8_ = plVar6[3];
    }
    else {
      local_578.field_2._M_allocated_capacity = *plVar11;
      local_578._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_578._M_string_length = plVar6[1];
    *plVar6 = (long)plVar11;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    paVar1 = &local_558.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_558._M_dataplus._M_p != paVar1) {
      operator_delete(local_558._M_dataplus._M_p,local_558.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_490._M_dataplus._M_p != &local_490.field_2) {
      operator_delete(local_490._M_dataplus._M_p,local_490.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_530._M_dataplus._M_p != paVar15) {
      operator_delete(local_530._M_dataplus._M_p,local_530.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
      operator_delete(local_4f0._M_dataplus._M_p,local_4f0.field_2._M_allocated_capacity + 1);
    }
    paVar2 = &local_4b0.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4b0._M_dataplus._M_p != paVar2) {
      operator_delete(local_4b0._M_dataplus._M_p,local_4b0.field_2._M_allocated_capacity + 1);
    }
    local_558._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_558,"INPUT_TYPE","");
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this_00->value_map_,&local_558);
    std::__cxx11::string::_M_assign((string *)pmVar8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_558._M_dataplus._M_p != paVar1) {
      operator_delete(local_558._M_dataplus._M_p,local_558.field_2._M_allocated_capacity + 1);
    }
    local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_290,
               "  int KeyCompareWithValue(const {{INPUT_TYPE}} *_{{FIELD_NAME}}) const {","");
    CodeWriter::operator+=(this_00,&local_290);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
    }
    local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2b0,
               "    const {{INPUT_TYPE}} *curr_{{FIELD_NAME}} = {{FIELD_NAME}}();","");
    CodeWriter::operator+=(this_00,&local_2b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
    }
    local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2d0,
               "    for (::flatbuffers::uoffset_t i = 0; i < curr_{{FIELD_NAME}}->size(); i++) {",""
              );
    CodeWriter::operator+=(this_00,&local_2d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
      operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
    }
    if (local_510._0_4_ - BASE_TYPE_UTYPE < 0xc) {
      local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2f0,"      const auto lhs = curr_{{FIELD_NAME}}->Get(i);","");
      CodeWriter::operator+=(this_00,&local_2f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
        operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
      }
      local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_310,"      const auto rhs = _{{FIELD_NAME}}->Get(i);","");
      CodeWriter::operator+=(this_00,&local_310);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_310._M_dataplus._M_p != &local_310.field_2) {
        operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
      }
      local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_330,"      if (lhs != rhs)","");
      CodeWriter::operator+=(this_00,&local_330);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_330._M_dataplus._M_p != &local_330.field_2) {
        operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
      }
      local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_350,
                 "        return static_cast<int>(lhs > rhs) - static_cast<int>(lhs < rhs);","");
      CodeWriter::operator+=(this_00,&local_350);
      _Var13._M_p = local_350._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_350._M_dataplus._M_p != &local_350.field_2) {
LAB_00187876:
        operator_delete(_Var13._M_p,local_350.field_2._M_allocated_capacity + 1);
      }
    }
    else if ((local_510._0_4_ == BASE_TYPE_STRUCT) && (*(bool *)(local_510._8_8_ + 0x110) == true))
    {
      local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_370,
                 "      const auto &lhs_{{FIELD_NAME}} = *(curr_{{FIELD_NAME}}->Get(i));","");
      CodeWriter::operator+=(this_00,&local_370);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_370._M_dataplus._M_p != &local_370.field_2) {
        operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
      }
      local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_390,
                 "      const auto &rhs_{{FIELD_NAME}} = *(_{{FIELD_NAME}}->Get(i));","");
      CodeWriter::operator+=(this_00,&local_390);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_390._M_dataplus._M_p != &local_390.field_2) {
        operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
      }
      uVar12 = local_510._8_8_;
      local_530._M_dataplus._M_p = (pointer)paVar15;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_530,"FIELD_NAME","");
      CodeWriter::GetValue(&local_558,this_00,&local_530);
      plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_558,0,(char *)0x0,0x369277);
      local_4d0._M_dataplus._M_p = (pointer)&local_4d0.field_2;
      psVar9 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_4d0.field_2._M_allocated_capacity = *psVar9;
        local_4d0.field_2._8_4_ = (undefined4)plVar6[3];
        local_4d0.field_2._12_4_ = *(undefined4 *)((long)plVar6 + 0x1c);
      }
      else {
        local_4d0.field_2._M_allocated_capacity = *psVar9;
        local_4d0._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_4d0._M_string_length = plVar6[1];
      *plVar6 = (long)psVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      local_4b0._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b0,"FIELD_NAME","");
      CodeWriter::GetValue(&local_4f0,this_00,&local_4b0);
      plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_4f0,0,(char *)0x0,0x36927c);
      psVar9 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_430.field_2._M_allocated_capacity = *psVar9;
        local_430.field_2._8_8_ = plVar6[3];
        local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
      }
      else {
        local_430.field_2._M_allocated_capacity = *psVar9;
        local_430._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_430._M_string_length = plVar6[1];
      *plVar6 = (long)psVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      GenComparatorForStruct(local_538,(StructDef *)uVar12,6,&local_4d0,&local_430);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_430._M_dataplus._M_p != &local_430.field_2) {
        operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
        operator_delete(local_4f0._M_dataplus._M_p,local_4f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4b0._M_dataplus._M_p != paVar2) {
        operator_delete(local_4b0._M_dataplus._M_p,local_4b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
        operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_558._M_dataplus._M_p != paVar1) {
        operator_delete(local_558._M_dataplus._M_p,local_558.field_2._M_allocated_capacity + 1);
      }
      local_350.field_2._M_allocated_capacity = local_530.field_2._M_allocated_capacity;
      _Var13._M_p = local_530._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_530._M_dataplus._M_p != paVar15) goto LAB_00187876;
    }
    local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"    }","");
    CodeWriter::operator+=(this_00,&local_3b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
      operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
    }
    local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"    return 0;","");
    CodeWriter::operator+=(this_00,&local_3d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
      operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
    }
    local_250.field_2._M_allocated_capacity = local_578.field_2._M_allocated_capacity;
    _Var13._M_p = local_578._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_578._M_dataplus._M_p == &local_578.field_2) goto LAB_00187dfe;
  }
  else {
    type_00 = &field->value;
    if (bVar14 == 0) {
      if (0xb < (type_00->type).base_type - BASE_TYPE_UTYPE) {
        __assert_fail("IsScalar(field.value.type.base_type)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_cpp.cpp"
                      ,0x9c6,
                      "void flatbuffers::cpp::CppGenerator::GenKeyFieldMethods(const FieldDef &)");
      }
      GenTypeBasic_abi_cxx11_((string *)local_510,local_538,&type_00->type,false);
      if ((((pCVar5->opts_).super_IDLOptions.scoped_enums == true) &&
          ((field->value).type.enum_def != (EnumDef *)0x0)) &&
         ((type_00->type).base_type - BASE_TYPE_UTYPE < 0xc)) {
        GenTypeGet_abi_cxx11_(&local_578,local_538,&type_00->type," ","const "," *",true);
        std::__cxx11::string::operator=((string *)local_510,(string *)&local_578);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_578._M_dataplus._M_p != &local_578.field_2) {
          operator_delete(local_578._M_dataplus._M_p,
                          (ulong)(local_578.field_2._M_allocated_capacity + 1));
        }
      }
      local_578._M_dataplus._M_p = (pointer)&local_578.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_578,"KEY_TYPE","");
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this_00->value_map_,&local_578);
      std::__cxx11::string::_M_assign((string *)pmVar8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_578._M_dataplus._M_p != &local_578.field_2) {
        operator_delete(local_578._M_dataplus._M_p,
                        (ulong)(local_578.field_2._M_allocated_capacity + 1));
      }
      local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_3f0,
                 "  int KeyCompareWithValue({{KEY_TYPE}} _{{FIELD_NAME}}) const {","");
      CodeWriter::operator+=(this_00,&local_3f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
        operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
      }
      local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_410,
                 "    return static_cast<int>({{FIELD_NAME}}() > _{{FIELD_NAME}}) - static_cast<int>({{FIELD_NAME}}() < _{{FIELD_NAME}});"
                 ,"");
      CodeWriter::operator+=(this_00,&local_410);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_410._M_dataplus._M_p != &local_410.field_2) {
        operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
      }
      local_250.field_2._M_allocated_capacity = local_510._16_8_;
      _Var13._M_p = (pointer)local_510._0_8_;
      if ((_Alloc_hider *)local_510._0_8_ == (_Alloc_hider *)(local_510 + 0x10)) goto LAB_00187dfe;
    }
    else {
      struct_def = (field->value).type.struct_def;
      p_Var4 = (_Alloc_hider *)(local_510 + 0x10);
      local_510._0_8_ = p_Var4;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_510,"INPUT_TYPE","");
      GenTypeGet_abi_cxx11_(&local_578,local_538,&type_00->type,"","","",false);
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this_00->value_map_,(key_type *)local_510);
      std::__cxx11::string::_M_assign((string *)pmVar8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_578._M_dataplus._M_p != &local_578.field_2) {
        operator_delete(local_578._M_dataplus._M_p,
                        (ulong)(local_578.field_2._M_allocated_capacity + 1));
      }
      if ((_Alloc_hider *)local_510._0_8_ != p_Var4) {
        operator_delete((void *)local_510._0_8_,(ulong)(local_510._16_8_ + 1));
      }
      local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1f0,
                 "  int KeyCompareWithValue(const {{INPUT_TYPE}} &_{{FIELD_NAME}}) const {","");
      CodeWriter::operator+=(this_00,&local_1f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
      }
      local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_210,"    const auto &lhs_{{FIELD_NAME}} = {{FIELD_NAME}}();","");
      CodeWriter::operator+=(this_00,&local_210);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
      }
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_230,"    const auto &rhs_{{FIELD_NAME}} = _{{FIELD_NAME}};","");
      CodeWriter::operator+=(this_00,&local_230);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
      }
      local_578._M_dataplus._M_p = (pointer)&local_578.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_578,"FIELD_NAME","");
      CodeWriter::GetValue((string *)local_510,this_00,&local_578);
      plVar6 = (long *)std::__cxx11::string::replace((ulong)local_510,0,(char *)0x0,0x369277);
      psVar9 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_470.field_2._M_allocated_capacity = *psVar9;
        local_470.field_2._8_4_ = (undefined4)plVar6[3];
        local_470.field_2._12_4_ = *(undefined4 *)((long)plVar6 + 0x1c);
        local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
      }
      else {
        local_470.field_2._M_allocated_capacity = *psVar9;
        local_470._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_470._M_string_length = plVar6[1];
      *plVar6 = (long)psVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      local_530._M_dataplus._M_p = (pointer)&local_530.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_530,"FIELD_NAME","");
      CodeWriter::GetValue(&local_558,this_00,&local_530);
      plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_558,0,(char *)0x0,0x36927c);
      psVar9 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_450.field_2._M_allocated_capacity = *psVar9;
        local_450.field_2._8_8_ = plVar6[3];
        local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
      }
      else {
        local_450.field_2._M_allocated_capacity = *psVar9;
        local_450._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_450._M_string_length = plVar6[1];
      *plVar6 = (long)psVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      GenComparatorForStruct(local_538,struct_def,4,&local_470,&local_450);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_450._M_dataplus._M_p != &local_450.field_2) {
        operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_558._M_dataplus._M_p != &local_558.field_2) {
        operator_delete(local_558._M_dataplus._M_p,local_558.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_530._M_dataplus._M_p != &local_530.field_2) {
        operator_delete(local_530._M_dataplus._M_p,local_530.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_470._M_dataplus._M_p != &local_470.field_2) {
        operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
      }
      if ((_Alloc_hider *)local_510._0_8_ != p_Var4) {
        operator_delete((void *)local_510._0_8_,(ulong)(local_510._16_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_578._M_dataplus._M_p != &local_578.field_2) {
        operator_delete(local_578._M_dataplus._M_p,
                        (ulong)(local_578.field_2._M_allocated_capacity + 1));
      }
      local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"    return 0;","");
      CodeWriter::operator+=(this_00,&local_250);
      _Var13._M_p = local_250._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p == &local_250.field_2) goto LAB_00187dfe;
    }
  }
  operator_delete(_Var13._M_p,
                  (ulong)((long)&(((EnumDef *)local_250.field_2._M_allocated_capacity)->
                                 super_Definition).name._M_dataplus._M_p + 1));
LAB_00187dfe:
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"  }","");
  CodeWriter::operator+=(this_00,&local_270);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void GenKeyFieldMethods(const FieldDef &field) {
    FLATBUFFERS_ASSERT(field.key);
    const bool is_string = IsString(field.value.type);
    const bool is_array = IsArray(field.value.type);
    const bool is_struct = IsStruct(field.value.type);
    // Generate KeyCompareLessThan function
    code_ +=
        "  bool KeyCompareLessThan(const {{STRUCT_NAME}} * const o) const {";
    if (is_string) {
      // use operator< of ::flatbuffers::String
      code_ += "    return *{{FIELD_NAME}}() < *o->{{FIELD_NAME}}();";
    } else if (is_array || is_struct) {
      code_ += "    return KeyCompareWithValue(o->{{FIELD_NAME}}()) < 0;";
    } else {
      code_ += "    return {{FIELD_NAME}}() < o->{{FIELD_NAME}}();";
    }
    code_ += "  }";

    // Generate KeyCompareWithValue function
    if (is_string) {
      // Compares key against a null-terminated char array.
      code_ += "  int KeyCompareWithValue(const char *_{{FIELD_NAME}}) const {";
      code_ += "    return strcmp({{FIELD_NAME}}()->c_str(), _{{FIELD_NAME}});";
      code_ += "  }";
      // Compares key against any string-like object (e.g. std::string_view or
      // std::string) that implements operator< comparison with const char*.
      code_ += "  template<typename StringType>";
      code_ +=
          "  int KeyCompareWithValue(const StringType& _{{FIELD_NAME}}) const "
          "{";
      code_ +=
          "    if ({{FIELD_NAME}}()->c_str() < _{{FIELD_NAME}}) return -1;";
      code_ += "    if (_{{FIELD_NAME}} < {{FIELD_NAME}}()->c_str()) return 1;";
      code_ += "    return 0;";
    } else if (is_array) {
      const auto &elem_type = field.value.type.VectorType();
      std::string input_type = "::flatbuffers::Array<" +
                               GenTypeGet(elem_type, "", "", "", false) + ", " +
                               NumToString(elem_type.fixed_length) + ">";
      code_.SetValue("INPUT_TYPE", input_type);
      code_ +=
          "  int KeyCompareWithValue(const {{INPUT_TYPE}} *_{{FIELD_NAME}}"
          ") const {";
      code_ +=
          "    const {{INPUT_TYPE}} *curr_{{FIELD_NAME}} = {{FIELD_NAME}}();";
      code_ +=
          "    for (::flatbuffers::uoffset_t i = 0; i < "
          "curr_{{FIELD_NAME}}->size(); i++) {";

      if (IsScalar(elem_type.base_type)) {
        code_ += "      const auto lhs = curr_{{FIELD_NAME}}->Get(i);";
        code_ += "      const auto rhs = _{{FIELD_NAME}}->Get(i);";
        code_ += "      if (lhs != rhs)";
        code_ +=
            "        return static_cast<int>(lhs > rhs)"
            " - static_cast<int>(lhs < rhs);";
      } else if (IsStruct(elem_type)) {
        code_ +=
            "      const auto &lhs_{{FIELD_NAME}} = "
            "*(curr_{{FIELD_NAME}}->Get(i));";
        code_ +=
            "      const auto &rhs_{{FIELD_NAME}} = "
            "*(_{{FIELD_NAME}}->Get(i));";
        GenComparatorForStruct(*elem_type.struct_def, 6,
                               "lhs_" + code_.GetValue("FIELD_NAME"),
                               "rhs_" + code_.GetValue("FIELD_NAME"));
      }
      code_ += "    }";
      code_ += "    return 0;";
    } else if (is_struct) {
      const auto *struct_def = field.value.type.struct_def;
      code_.SetValue("INPUT_TYPE",
                     GenTypeGet(field.value.type, "", "", "", false));
      code_ +=
          "  int KeyCompareWithValue(const {{INPUT_TYPE}} &_{{FIELD_NAME}}) "
          "const {";
      code_ += "    const auto &lhs_{{FIELD_NAME}} = {{FIELD_NAME}}();";
      code_ += "    const auto &rhs_{{FIELD_NAME}} = _{{FIELD_NAME}};";
      GenComparatorForStruct(*struct_def, 4,
                             "lhs_" + code_.GetValue("FIELD_NAME"),
                             "rhs_" + code_.GetValue("FIELD_NAME"));
      code_ += "    return 0;";

    } else {
      FLATBUFFERS_ASSERT(IsScalar(field.value.type.base_type));
      auto type = GenTypeBasic(field.value.type, false);
      if (opts_.scoped_enums && field.value.type.enum_def &&
          IsScalar(field.value.type.base_type)) {
        type = GenTypeGet(field.value.type, " ", "const ", " *", true);
      }
      // Returns {field<val: -1, field==val: 0, field>val: +1}.
      code_.SetValue("KEY_TYPE", type);
      code_ +=
          "  int KeyCompareWithValue({{KEY_TYPE}} _{{FIELD_NAME}}) const {";
      code_ +=
          "    return static_cast<int>({{FIELD_NAME}}() > _{{FIELD_NAME}}) - "
          "static_cast<int>({{FIELD_NAME}}() < _{{FIELD_NAME}});";
    }
    code_ += "  }";
  }